

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_3>,_tcu::Vector<tcu::Interval,_3>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<int,_3> *value)

{
  long lVar1;
  Interval *pIVar2;
  int ndx;
  Interval local_60;
  Interval local_48;
  
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x58);
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x58);
  lVar1 = 0;
  pIVar2 = __return_storage_ptr__->m_data;
  do {
    local_60.m_lo = (double)value->m_data[lVar1];
    local_60.m_hasNaN = false;
    local_60.m_hi = local_60.m_lo;
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    pIVar2->m_hi = local_48.m_hi;
    pIVar2->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar2->field_0x1 = local_48._1_7_;
    pIVar2->m_lo = local_48.m_lo;
    lVar1 = lVar1 + 1;
    pIVar2 = pIVar2 + 1;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}